

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseVisibilityTest_Edition2024NonStrictLocalEnum_Test::
~ParseVisibilityTest_Edition2024NonStrictLocalEnum_Test
          (ParseVisibilityTest_Edition2024NonStrictLocalEnum_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseVisibilityTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2024NonStrictLocalEnum) {
  ExpectParsesTo(
      R"schema(
        edition = "2024";
        local enum D {
          D_VAL = 0;
        }
        )schema",
      R"pb(enum_type {
             name: "D"
             visibility: VISIBILITY_LOCAL
             value { name: "D_VAL" number: 0 }
           }
           syntax: "editions"
           edition: EDITION_2024
      )pb");
}